

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemUtils.cpp
# Opt level: O3

void ApprovalTests::SystemUtils::makeDirectoryForNonWindows(string *directory)

{
  int iVar1;
  runtime_error *this;
  string helpMessage;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  iVar1 = mkdir((directory->_M_dataplus)._M_p,0x1db);
  if (iVar1 == 0) {
    return;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,"Unable to create directory: ","");
  ::std::operator+(&local_30,&local_50,directory);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this,(string *)&local_30);
  __cxa_throw(this,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void SystemUtils::makeDirectoryForNonWindows(const std::string& directory)
    {
        APPROVAL_TESTS_UNUSED(directory);
#ifndef _WIN32
        mode_t nMode = 0733; // UNIX style permissions
        int nError = mkdir(directory.c_str(), nMode);
        if (nError != 0)
        {
            std::string helpMessage =
                std::string("Unable to create directory: ") + directory;
            throw std::runtime_error(helpMessage);
        }
#endif
    }